

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

DeepScanLineOutputFile * __thiscall
Imf_3_4::MultiPartOutputFile::getOutputPart<Imf_3_4::DeepScanLineOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  ArgExc *this_00;
  map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
  *this_01;
  mapped_type *ppGVar4;
  int in_ESI;
  long in_RDI;
  DeepScanLineOutputFile *file;
  lock_guard<std::mutex> lock;
  stringstream _iex_throw_s;
  map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
  *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  pair<int,_Imf_3_4::GenericOutputFile_*> *in_stack_fffffffffffffd98;
  key_type_conflict *in_stack_fffffffffffffdc8;
  map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
  *in_stack_fffffffffffffdd0;
  _Self local_1c8;
  _Self local_1c0 [4];
  stringstream local_1a0 [16];
  ostream local_190 [248];
  OutputPartData *in_stack_ffffffffffffff68;
  DeepScanLineOutputFile *in_stack_ffffffffffffff70;
  DeepScanLineOutputFile *local_8;
  
  if (-1 < in_ESI) {
    sVar2 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                      ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                       (*(long *)(in_RDI + 8) + 0x88));
    if (in_ESI < (int)sVar2) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (mutex_type *)in_stack_fffffffffffffd88);
      local_1c0[0]._M_node =
           (_Base_ptr)
           std::
           map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
           ::find(in_stack_fffffffffffffd88,(key_type_conflict *)0x20fc3e);
      local_1c8._M_node =
           (_Base_ptr)
           std::
           map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
           ::end(in_stack_fffffffffffffd88);
      bVar1 = std::operator==(local_1c0,&local_1c8);
      if (bVar1) {
        local_8 = (DeepScanLineOutputFile *)operator_new(0x10);
        std::vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>::
        operator[]((vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_> *)
                   (*(long *)(in_RDI + 8) + 0x38),(long)in_ESI);
        DeepScanLineOutputFile::DeepScanLineOutputFile
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        this_01 = (map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
                   *)(*(long *)(in_RDI + 8) + 0x58);
        std::make_pair<int&,Imf_3_4::GenericOutputFile*>
                  ((int *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                   (GenericOutputFile **)in_stack_fffffffffffffd88);
        std::
        map<int,Imf_3_4::GenericOutputFile*,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
        ::insert<std::pair<int,Imf_3_4::GenericOutputFile*>>(this_01,in_stack_fffffffffffffd98);
      }
      else {
        ppGVar4 = std::
                  map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
                  ::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        local_8 = (DeepScanLineOutputFile *)*ppGVar4;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20fdf9);
      return local_8;
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,
                           "MultiPartOutputFile::getOutputPart called with invalid part number  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
  poVar3 = std::operator<<(poVar3," on file with ");
  sVar2 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                    ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                     (*(long *)(in_RDI + 8) + 0x88));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  std::operator<<(poVar3," parts");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

T*
MultiPartOutputFile::getOutputPart (int partNumber)
{

    if (partNumber < 0 || partNumber >= int (_data->_headers.size ()))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartOutputFile::getOutputPart called with invalid part number  "
                << partNumber << " on file with " << _data->_headers.size ()
                << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data);
#endif
    if (_data->_outputFiles.find (partNumber) == _data->_outputFiles.end ())
    {
        T* file = new T (_data->parts[partNumber]);
        _data->_outputFiles.insert (
            std::make_pair (partNumber, (GenericOutputFile*) file));
        return file;
    }
    else
        return (T*) _data->_outputFiles[partNumber];
}